

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harmonic.cpp
# Opt level: O0

void __thiscall Harmonic::star_map(Harmonic *this)

{
  bool bVar1;
  int iVar2;
  tVertex this_00;
  Point *pPVar3;
  CVertexTrait *this_01;
  Point *pPVar4;
  double s;
  tVertex vertex_1;
  SolidVertexIterator viter_1;
  tVertex vertex;
  undefined1 local_148 [8];
  SolidVertexIterator viter;
  Point center;
  Harmonic *this_local;
  
  MeshLib::Point::Point((Point *)&viter.m_iter.m_root,0.0,0.0,0.0);
  MeshLib::SolidVertexIterator::SolidVertexIterator((SolidVertexIterator *)local_148,this->_nmesh);
  while( true ) {
    bVar1 = MeshLib::SolidVertexIterator::end((SolidVertexIterator *)local_148);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    viter_1.m_iter.m_root =
         (Node<MeshLib::Vertex> *)
         MeshLib::SolidVertexIterator::operator*((SolidVertexIterator *)local_148);
    pPVar3 = MeshLib::Vertex::point((Vertex *)viter_1.m_iter.m_root);
    MeshLib::Point::operator+=((Point *)&viter.m_iter.m_root,pPVar3);
    MeshLib::SolidVertexIterator::operator++((SolidVertexIterator *)local_148);
  }
  MeshLib::SolidVertexIterator::~SolidVertexIterator((SolidVertexIterator *)local_148);
  iVar2 = MeshLib::Solid::numVertices(this->_nmesh);
  MeshLib::Point::operator/=((Point *)&viter.m_iter.m_root,(double)iVar2);
  MeshLib::SolidVertexIterator::SolidVertexIterator((SolidVertexIterator *)&vertex_1,this->_nmesh);
  while( true ) {
    bVar1 = MeshLib::SolidVertexIterator::end((SolidVertexIterator *)&vertex_1);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this_00 = MeshLib::SolidVertexIterator::operator*((SolidVertexIterator *)&vertex_1);
    pPVar3 = MeshLib::Vertex::point(this_00);
    MeshLib::Point::operator-=(pPVar3,(Point *)&viter.m_iter.m_root);
    pPVar3 = MeshLib::Vertex::point(this_00);
    s = MeshLib::Point::norm(pPVar3);
    pPVar3 = MeshLib::Vertex::point(this_00);
    MeshLib::Point::operator/=(pPVar3,s);
    pPVar3 = MeshLib::Vertex::point(this_00);
    this_01 = MeshLib::trait<MeshLib::CVertexTrait,MeshLib::Vertex>(this_00);
    pPVar4 = MeshLib::CVertexTrait::normal(this_01);
    pPVar4->v[0] = pPVar3->v[0];
    pPVar4->v[1] = pPVar3->v[1];
    pPVar4->v[2] = pPVar3->v[2];
    MeshLib::SolidVertexIterator::operator++((SolidVertexIterator *)&vertex_1);
  }
  MeshLib::SolidVertexIterator::~SolidVertexIterator((SolidVertexIterator *)&vertex_1);
  MeshLib::Point::~Point((Point *)&viter.m_iter.m_root);
  return;
}

Assistant:

void Harmonic::star_map() {
	Point center(0, 0, 0);
	for (SolidVertexIterator viter(_nmesh); !viter.end(); ++viter) {
		Solid::tVertex vertex = *viter;
		center += vertex->point();
	}
	center /= _nmesh->numVertices();
	for (SolidVertexIterator viter(_nmesh); !viter.end(); ++viter) {
		Solid::tVertex vertex = *viter;
		vertex->point() -= center;
		vertex->point() /= vertex->point().norm();
		v_n(vertex) = vertex->point();
	}
}